

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_TextureCoordinates * __thiscall
ON_Mesh::GetCachedTextureCoordinates
          (ON_Mesh *this,ONX_Model *onx_model,ON_Texture *texture,ON_MappingRef *mapping_ref)

{
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> get_mapping_func;
  bool bVar1;
  ON__UINT32 OVar2;
  ON_TextureCoordinates *pOVar3;
  ON_UUID *mapping_id;
  ulong uVar4;
  ON_Xform ocsTransform;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 uVar5;
  code *pcVar6;
  undefined1 local_d0 [40];
  undefined8 local_a8;
  ON_Xform local_a0;
  
  uVar5 = (_Manager_type)0x0;
  pcVar6 = std::
           _Function_handler<ON_TextureMapping_(const_ON_MappingChannel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp:4670:27)>
           ::_M_manager;
  bVar1 = ON_Texture::IsWcsProjected(texture);
  if ((bVar1) || (bVar1 = ON_Texture::IsWcsBoxProjected(texture), bVar1)) {
    std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function
              ((function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)local_d0,
               (function<ON_TextureMapping_(const_ON_MappingChannel_*)> *)&stack0xffffffffffffff10);
    get_mapping_func.super__Function_base._M_functor._8_8_ = onx_model;
    get_mapping_func.super__Function_base._M_functor._M_unused._M_object =
         (void *)in_stack_ffffffffffffff08;
    get_mapping_func.super__Function_base._M_manager = (_Manager_type)uVar5;
    get_mapping_func._M_invoker = pcVar6;
    GetOcsTransform(&local_a0,get_mapping_func,(ON_MappingRef *)local_d0);
    if ((_func_int **)local_d0._16_8_ != (_func_int **)0x0) {
      (*(code *)local_d0._16_8_)(local_d0,local_d0,3);
    }
    bVar1 = ON_Texture::IsWcsBoxProjected(texture);
    uVar4 = 0x4e3d341e47d62129;
    if (bVar1) {
      uVar4 = 0x46fb96174dc9aa78;
    }
    OVar2 = ON_Xform::CRC32(&local_a0,(ON__UINT32)uVar4);
    local_a8 = 0x98edf41a059c11bf;
    if (bVar1) {
      local_a8 = 0xfc8241e1653e3f92;
    }
    local_d0._32_8_ = (ulong)OVar2 | uVar4 & 0x4effb61f00000000;
    pOVar3 = CachedTextureCoordinates(this,(ON_UUID *)(local_d0 + 0x20));
  }
  else {
    if (mapping_ref == (ON_MappingRef *)0x0) {
      mapping_id = &ON_TextureMapping::SurfaceParameterTextureMappingId;
    }
    else {
      mapping_id = &ON_MappingRef::MappingChannel(mapping_ref,texture->m_mapping_channel_id)->
                    m_mapping_id;
      if ((ON_MappingChannel *)mapping_id == (ON_MappingChannel *)0x0) {
        pOVar3 = (ON_TextureCoordinates *)0x0;
        goto LAB_005014cb;
      }
    }
    pOVar3 = CachedTextureCoordinates(this,mapping_id);
  }
LAB_005014cb:
  if (pcVar6 != (_Manager_type)0x0) {
    (*pcVar6)((_Any_data *)&stack0xffffffffffffff10,(_Any_data *)&stack0xffffffffffffff10,
              __destroy_functor);
  }
  return pOVar3;
}

Assistant:

const ON_TextureCoordinates* ON_Mesh::GetCachedTextureCoordinates(const ONX_Model& onx_model, const ON_Texture& texture, const ON_MappingRef* mapping_ref) const
{
  auto get_mapping_func = [&onx_model](const ON_MappingChannel* pMC)
    {
      return ONX_Model_GetTextureMappingHelper(onx_model, pMC);
    };

  return ::Internal_GetCachedTextureCoordinates(*this, get_mapping_func, texture, mapping_ref);
}